

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O0

int deqp::gles31::Functional::anon_unknown_0::getNumTextureSamplingDimensions(TextureType type)

{
  undefined4 local_c;
  TextureType type_local;
  
  if (type == TEXTURETYPE_2D) {
    local_c = 2;
  }
  else if (type == TEXTURETYPE_CUBE) {
    local_c = 3;
  }
  else if (type == TEXTURETYPE_2D_ARRAY) {
    local_c = 3;
  }
  else {
    local_c = -1;
  }
  return local_c;
}

Assistant:

static inline int getNumTextureSamplingDimensions (TextureType type)
{
	switch (type)
	{
		case TEXTURETYPE_2D:		return 2;
		case TEXTURETYPE_2D_ARRAY:	return 3;
		case TEXTURETYPE_CUBE:		return 3;
		default: DE_ASSERT(false); return -1;
	}
}